

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::MaskProportionalityCase::init
          (MaskProportionalityCase *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  deBool dVar2;
  int iVar3;
  int extraout_EAX;
  MessageBuilder *pMVar4;
  MessageBuilder local_328;
  MessageBuilder local_198;
  TestLog *local_18;
  TestLog *log;
  MaskProportionalityCase *this_local;
  
  log = (TestLog *)this;
  local_18 = tcu::TestContext::getLog
                       ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  MultisampleCase::init(&this->super_MultisampleCase,ctx);
  if (this->m_type == CASETYPE_ALPHA_TO_COVERAGE) {
    do {
      glwEnable(0x809e);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                      ,0x4f8);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    tcu::TestLog::operator<<(&local_198,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_198,(char (*) [39])"GL_SAMPLE_ALPHA_TO_COVERAGE is enabled");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
  }
  else {
    do {
      glwEnable(0x80a0);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glEnable(GL_SAMPLE_COVERAGE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                      ,0x4ff);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    tcu::TestLog::operator<<(&local_328,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_328,(char (*) [30])"GL_SAMPLE_COVERAGE is enabled");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_328);
  }
  iVar3 = getIterationCount((this->super_MultisampleCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx,(this->super_MultisampleCase).m_numSamples * 5)
  ;
  iVar3 = de::max<int>(2,iVar3);
  this->m_numIterations = iVar3;
  MultisampleCase::randomizeViewport(&this->super_MultisampleCase);
  return extraout_EAX;
}

Assistant:

void MaskProportionalityCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	MultisampleCase::init();

	if (m_type == CASETYPE_ALPHA_TO_COVERAGE)
	{
		GLU_CHECK_CALL(glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE));
		log << TestLog::Message << "GL_SAMPLE_ALPHA_TO_COVERAGE is enabled" << TestLog::EndMessage;
	}
	else
	{
		DE_ASSERT(m_type == CASETYPE_SAMPLE_COVERAGE || m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED);

		GLU_CHECK_CALL(glEnable(GL_SAMPLE_COVERAGE));
		log << TestLog::Message << "GL_SAMPLE_COVERAGE is enabled" << TestLog::EndMessage;
	}

	m_numIterations = de::max(2, getIterationCount(m_testCtx, m_numSamples * 5));

	randomizeViewport(); // \note Using the same viewport for every iteration since coverage mask may depend on window-relative pixel coordinate.
}